

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O0

Array<asl::String> __thiscall asl::Array<asl::File>::with<asl::String>(Array<asl::File> *this)

{
  int iVar1;
  String *s;
  String *this_00;
  Array<asl::File> *in_RSI;
  int local_20;
  int i;
  Array<asl::File> *this_local;
  Array<asl::String> *b;
  
  iVar1 = length(in_RSI);
  Array<asl::String>::Array((Array<asl::String> *)this,iVar1);
  for (local_20 = 0; iVar1 = length(in_RSI), local_20 < iVar1; local_20 = local_20 + 1) {
    s = File::path(in_RSI->_a + local_20);
    this_00 = Array<asl::String>::operator[]((Array<asl::String> *)this,local_20);
    asl::String::operator=(this_00,s);
  }
  return (Array<asl::String>)(String *)this;
}

Assistant:

ASL_API Array<String> Array<File>::with<String>() const
{
	Array<String> b(length());
	for (int i = 0; i < length(); i++)
		b[i] = _a[i].path();
	return b;
}